

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

char * TEST_mutex_group_context_fail(void)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  undefined8 *puVar4;
  char *pcVar5;
  cargo_t cargo;
  test_grp_ctx_t mgroup_ctx1;
  cargo_t local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined4 local_28;
  
  iVar1 = cargo_init(&local_50,0,"program");
  if (iVar1 == 0) {
    uStack_40 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0x6f6c6c6568;
    local_28 = 0x14;
    iVar1 = cargo_add_mutex_group(local_50,0,"mgroup1",(char *)0x0,(char *)0x0);
    iVar2 = _cargo_set_group_context
                      (local_50,"mgroup1",local_50->mutex_groups,local_50->mutex_group_count,
                       &local_48);
    if (iVar2 == 0 && iVar1 == 0) {
      pvVar3 = _cargo_get_group_context
                         (local_50,"mgroup2",local_50->mutex_groups,local_50->mutex_group_count);
      if (pvVar3 == (void *)0x0) {
        puVar4 = (undefined8 *)
                 _cargo_get_group_context
                           (local_50,"mgroup1",local_50->mutex_groups,local_50->mutex_group_count);
        pcVar5 = (char *)0x0;
        if (puVar4 != &local_48) {
          pcVar5 = "Did not get correct mutex group context";
        }
      }
      else {
        pcVar5 = "Got non-NULL mutex group context for non-existent group";
      }
    }
    else {
      pcVar5 = "Failed to add mutex group 1";
    }
    cargo_destroy(&local_50);
  }
  else {
    pcVar5 = "Failed to init cargo";
  }
  return pcVar5;
}

Assistant:

_TEST_START(TEST_mutex_group_context_fail)
{
    void *user = NULL;
    test_grp_ctx_t mgroup_ctx1 = { "hello", 20 };
    int i = 3;
    ret |= cargo_add_mutex_group(cargo, 0, "mgroup1", NULL, NULL);
    ret |= cargo_set_mutex_group_context(cargo, "mgroup1", &mgroup_ctx1);
    cargo_assert(ret == 0, "Failed to add mutex group 1");

    user = cargo_get_mutex_group_context(cargo, "mgroup2");
    cargo_assert(user == NULL, "Got non-NULL mutex group context for non-existent group");

    user = cargo_get_mutex_group_context(cargo, "mgroup1");
    cargo_assert(user == &mgroup_ctx1, "Did not get correct mutex group context");

    _TEST_CLEANUP();
}